

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

void envy_bios_print_conn(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_conn *peVar1;
  envy_bios_conn_entry *peVar2;
  char *pcVar3;
  char *typename;
  envy_bios_conn_entry *entry;
  int i;
  envy_bios_conn *conn;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->conn;
  if ((peVar1->offset != 0) && ((mask & 0x100000) != 0)) {
    if ((bios->conn).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse CONN table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->conn).version >> 4),
              (ulong)((bios->conn).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"CONN table at 0x%04x version %d.%d\n",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->conn).version >> 4),
              (ulong)((bios->conn).version & 0xf));
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->conn).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->conn).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->conn).entries + (int)entry._4_4_;
        if ((peVar2->type != 0xff) || ((mask & 0x40000000) != 0)) {
          pcVar3 = find_enum(conn_types,(uint)peVar2->type);
          fprintf((FILE *)out,"CONN %d:",(ulong)entry._4_4_);
          fprintf((FILE *)out," type 0x%02x [%s] tag %d",(ulong)peVar2->type,pcVar3,
                  (ulong)peVar2->tag);
          if (peVar2->hpd != -1) {
            fprintf((FILE *)out," HPD_%d",(ulong)(uint)(int)peVar2->hpd);
          }
          if (peVar2->dp_ext != -1) {
            fprintf((FILE *)out," DP_EXT_%d",(ulong)(uint)(int)peVar2->dp_ext);
          }
          if (peVar2->unk02_2 != '\0') {
            fprintf((FILE *)out," unk02_2 0x%02x",(ulong)peVar2->unk02_2);
          }
          if (peVar2->unk02_4 != '\0') {
            fprintf((FILE *)out," unk02_4 0x%02x",(ulong)peVar2->unk02_4);
          }
          if (peVar2->unk02_7 != '\0') {
            fprintf((FILE *)out," unk02_7 0x%02x",(ulong)peVar2->unk02_7);
          }
          if (peVar2->unk03_3 != '\0') {
            fprintf((FILE *)out," unk03_3 0x%02x",(ulong)peVar2->unk03_3);
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->conn).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_conn (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset || !(mask & ENVY_BIOS_PRINT_CONN))
		return;
	if (!conn->valid) {
		fprintf(out, "Failed to parse CONN table at 0x%04x version %d.%d\n\n", conn->offset, conn->version >> 4, conn->version & 0xf);
		return;
	}
	fprintf(out, "CONN table at 0x%04x version %d.%d\n", conn->offset, conn->version >> 4, conn->version & 0xf);
	envy_bios_dump_hex(bios, out, conn->offset, conn->hlen, mask);
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		if (entry->type != ENVY_BIOS_CONN_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(conn_types, entry->type);
			fprintf(out, "CONN %d:", i);
			fprintf(out, " type 0x%02x [%s] tag %d", entry->type, typename, entry->tag);
			if (entry->hpd != -1)
				fprintf(out, " HPD_%d", entry->hpd);
			if (entry->dp_ext != -1)
				fprintf(out, " DP_EXT_%d", entry->dp_ext);
			if (entry->unk02_2)
				fprintf(out, " unk02_2 0x%02x", entry->unk02_2);
			if (entry->unk02_4)
				fprintf(out, " unk02_4 0x%02x", entry->unk02_4);
			if (entry->unk02_7)
				fprintf(out, " unk02_7 0x%02x", entry->unk02_7);
			if (entry->unk03_3)
				fprintf(out, " unk03_3 0x%02x", entry->unk03_3);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, conn->rlen, mask);
	}
	fprintf(out, "\n");
}